

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O3

bool crnlib::string_to_uint64(char **pBuf,uint64 *value)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  
  *value = 0;
  pcVar6 = *pBuf;
  cVar1 = *pcVar6;
  while( true ) {
    if (cVar1 == '\0') {
      return false;
    }
    iVar3 = isspace((int)cVar1);
    if (iVar3 == 0) break;
    cVar1 = pcVar6[1];
    pcVar6 = pcVar6 + 1;
  }
  if (9 < (int)cVar1 - 0x30U) {
    return false;
  }
  uVar4 = 0;
  while( true ) {
    if ((*pcVar6 == '\0') || (uVar5 = (int)*pcVar6 - 0x30, 9 < uVar5)) {
      *value = uVar4;
      *pBuf = pcVar6;
      return true;
    }
    if (uVar4 >> 0x3d != 0) {
      return false;
    }
    if (CARRY8(uVar4 * 8,uVar4 * 2)) break;
    uVar2 = uVar4 * 10;
    pcVar6 = pcVar6 + 1;
    uVar4 = uVar5 + uVar2;
    if (CARRY8((ulong)uVar5,uVar2)) {
      return false;
    }
  }
  return false;
}

Assistant:

bool string_to_uint64(const char*& pBuf, uint64& value) {
  value = 0;

  CRNLIB_ASSERT(pBuf);
  const char* p = pBuf;

  while (*p && isspace(*p))
    p++;

  uint64 result = 0;

  if (!isdigit(*p))
    return false;

  while (*p && isdigit(*p)) {
    if (result & 0xE000000000000000ULL)
      return false;

    const uint64 result8 = result << 3U;
    const uint64 result2 = result << 1U;

    if (result2 > (0xFFFFFFFFFFFFFFFFULL - result8))
      return false;

    result = result8 + result2;

    uint c = p[0] - '0';
    if (c > (0xFFFFFFFFFFFFFFFFULL - result))
      return false;

    result += c;

    p++;
  }

  value = result;

  pBuf = p;

  return true;
}